

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O0

parser_map *
argagg::validate_definitions
          (parser_map *__return_storage_ptr__,
          vector<argagg::definition,_std::allocator<argagg::definition>_> *definitions)

{
  char cVar1;
  value_type pdVar2;
  undefined8 uVar3;
  __node_base_ptr this;
  bool bVar4;
  size_type sVar5;
  ostream *poVar6;
  invalid_flag *piVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar8;
  reference ppdVar9;
  definition *local_778;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>
  local_770;
  undefined1 local_741;
  string local_740 [32];
  undefined1 local_720 [8];
  ostringstream msg_3;
  definition *existing_long_flag;
  string local_598 [32];
  undefined1 local_578 [8];
  ostringstream msg_2;
  bool short_flag_already_exists;
  value_type existing_short_flag;
  size_t short_flag_letter;
  string local_3e0 [32];
  undefined1 local_3c0 [8];
  ostringstream msg_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_220 [48];
  undefined1 local_1f0 [8];
  ostringstream msg;
  definition *defn;
  const_iterator __end1;
  const_iterator __begin1;
  vector<argagg::definition,_std::allocator<argagg::definition>_> *__range1;
  undefined1 local_50 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
  long_map;
  vector<argagg::definition,_std::allocator<argagg::definition>_> *definitions_local;
  parser_map *map;
  
  long_map._M_h._M_single_bucket = (__node_base_ptr)definitions;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
                   *)local_50);
  memset(__return_storage_ptr__,0,0x838);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
  ::unordered_map(&__return_storage_ptr__->long_map,
                  (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
                   *)local_50);
  this = long_map._M_h._M_single_bucket;
  __end1 = std::vector<argagg::definition,_std::allocator<argagg::definition>_>::begin
                     ((vector<argagg::definition,_std::allocator<argagg::definition>_> *)
                      long_map._M_h._M_single_bucket);
  defn = (definition *)
         std::vector<argagg::definition,_std::allocator<argagg::definition>_>::end
                   ((vector<argagg::definition,_std::allocator<argagg::definition>_> *)this);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_argagg::definition_*,_std::vector<argagg::definition,_std::allocator<argagg::definition>_>_>
                                *)&defn);
    if (!bVar4) {
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>_>_>
                        *)local_50);
      return __return_storage_ptr__;
    }
    msg._368_8_ = __gnu_cxx::
                  __normal_iterator<const_argagg::definition_*,_std::vector<argagg::definition,_std::allocator<argagg::definition>_>_>
                  ::operator*(&__end1);
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&((reference)msg._368_8_)->flags);
    if (sVar5 == 0) break;
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(msg._368_8_ + 0x20);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_00);
    flag = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&flag), bVar4) {
      msg_1._368_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      pcVar8 = (char *)std::__cxx11::string::data();
      bVar4 = is_valid_flag_definition(pcVar8);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c0);
        poVar6 = std::operator<<((ostream *)local_3c0,"flag \"");
        poVar6 = std::operator<<(poVar6,(string *)msg_1._368_8_);
        poVar6 = std::operator<<(poVar6,"\" specified for option \"");
        poVar6 = std::operator<<(poVar6,(string *)msg._368_8_);
        std::operator<<(poVar6,"\" is invalid");
        piVar7 = (invalid_flag *)__cxa_allocate_exception(0x10);
        std::__cxx11::ostringstream::str();
        invalid_flag::runtime_error(piVar7,local_3e0);
        __cxa_throw(piVar7,&invalid_flag::typeinfo,invalid_flag::~invalid_flag);
      }
      pcVar8 = (char *)std::__cxx11::string::data();
      bVar4 = flag_is_short(pcVar8);
      if (bVar4) {
        pcVar8 = (char *)std::__cxx11::string::operator[](msg_1._368_8_);
        cVar1 = *pcVar8;
        ppdVar9 = std::array<const_argagg::definition_*,_256UL>::operator[]
                            (&__return_storage_ptr__->short_map,(long)cVar1);
        uVar3 = msg._368_8_;
        pdVar2 = *ppdVar9;
        msg_2._375_1_ = pdVar2 != (value_type)0x0;
        if ((bool)msg_2._375_1_) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_578);
          poVar6 = std::operator<<((ostream *)local_578,"duplicate short flag \"");
          poVar6 = std::operator<<(poVar6,(string *)msg_1._368_8_);
          poVar6 = std::operator<<(poVar6,"\" found, specified by both option  \"");
          poVar6 = std::operator<<(poVar6,(string *)msg._368_8_);
          poVar6 = std::operator<<(poVar6,"\" and option \"");
          std::operator<<(poVar6,(string *)pdVar2);
          piVar7 = (invalid_flag *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::str();
          invalid_flag::runtime_error(piVar7,local_598);
          __cxa_throw(piVar7,&invalid_flag::typeinfo,invalid_flag::~invalid_flag);
        }
        ppdVar9 = std::array<const_argagg::definition_*,_256UL>::operator[]
                            (&__return_storage_ptr__->short_map,(long)cVar1);
        *ppdVar9 = (value_type)uVar3;
      }
      else {
        bVar4 = parser_map::known_long_flag(__return_storage_ptr__,(string *)msg_1._368_8_);
        if (bVar4) {
          msg_3._368_8_ =
               parser_map::get_definition_for_long_flag
                         (__return_storage_ptr__,(string *)msg_1._368_8_);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
          poVar6 = std::operator<<((ostream *)local_720,"duplicate long flag \"");
          poVar6 = std::operator<<(poVar6,(string *)msg_1._368_8_);
          poVar6 = std::operator<<(poVar6,"\" found, specified by both option  \"");
          poVar6 = std::operator<<(poVar6,(string *)msg._368_8_);
          poVar6 = std::operator<<(poVar6,"\" and option \"");
          std::operator<<(poVar6,(string *)msg_3._368_8_);
          local_741 = 1;
          piVar7 = (invalid_flag *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::str();
          invalid_flag::runtime_error(piVar7,local_740);
          local_741 = 0;
          __cxa_throw(piVar7,&invalid_flag::typeinfo,invalid_flag::~invalid_flag);
        }
        local_778 = (definition *)msg._368_8_;
        std::make_pair<std::__cxx11::string_const&,argagg::definition_const*>
                  (&local_770,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   msg_1._368_8_,&local_778);
        std::
        unordered_map<std::__cxx11::string,argagg::definition_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,argagg::definition_const*>>>
        ::insert<std::pair<std::__cxx11::string,argagg::definition_const*>>
                  ((unordered_map<std::__cxx11::string,argagg::definition_const*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,argagg::definition_const*>>>
                    *)&__return_storage_ptr__->long_map,&local_770);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_argagg::definition_*>
        ::~pair(&local_770);
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_argagg::definition_*,_std::vector<argagg::definition,_std::allocator<argagg::definition>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
  poVar6 = std::operator<<((ostream *)local_1f0,"option \"");
  poVar6 = std::operator<<(poVar6,(string *)msg._368_8_);
  std::operator<<(poVar6,"\" has no flag definitions");
  piVar7 = (invalid_flag *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  invalid_flag::runtime_error(piVar7,local_220);
  __cxa_throw(piVar7,&invalid_flag::typeinfo,invalid_flag::~invalid_flag);
}

Assistant:

inline
parser_map validate_definitions(
  const std::vector<definition>& definitions)
{
  std::unordered_map<std::string, const definition*> long_map;
  parser_map map {{{nullptr}}, std::move(long_map)};

  for (auto& defn : definitions) {

    if (defn.flags.size() == 0) {
      std::ostringstream msg;
      msg << "option \"" << defn.name << "\" has no flag definitions";
      throw invalid_flag(msg.str());
    }

    for (auto& flag : defn.flags) {

      if (!is_valid_flag_definition(flag.data())) {
        std::ostringstream msg;
        msg << "flag \"" << flag << "\" specified for option \"" << defn.name
            << "\" is invalid";
        throw invalid_flag(msg.str());
      }

      if (flag_is_short(flag.data())) {
        const std::size_t short_flag_letter = static_cast<std::size_t>(flag[1]);
        const auto existing_short_flag =
          map.short_map[short_flag_letter];
        bool short_flag_already_exists = (existing_short_flag != nullptr);
        if (short_flag_already_exists) {
          std::ostringstream msg;
          msg << "duplicate short flag \"" << flag
              << "\" found, specified by both option  \"" << defn.name
              << "\" and option \"" << existing_short_flag->name;
          throw invalid_flag(msg.str());
        }
        map.short_map[static_cast<std::size_t>(short_flag_letter)] = &defn;
        continue;
      }

      // If we're here then this is a valid, long-style flag.
      if (map.known_long_flag(flag)) {
        const auto existing_long_flag = map.get_definition_for_long_flag(flag);
        std::ostringstream msg;
        msg << "duplicate long flag \"" << flag
            << "\" found, specified by both option  \"" << defn.name
            << "\" and option \"" << existing_long_flag->name;
        throw invalid_flag(msg.str());
      }
      map.long_map.insert(std::make_pair(flag, &defn));
    }
  }

  return map;
}